

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.hpp
# Opt level: O0

void __thiscall libtorrent::aux::session_impl::call_abort(session_impl *this)

{
  io_context *ctx;
  error_handler_interface *in_R8;
  aux local_50 [16];
  allocating_handler<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_include_libtorrent_aux__session_impl_hpp:352:41),_72UL,_(libtorrent::aux::HandlerName)4>
  local_40;
  undefined1 local_20 [8];
  shared_ptr<libtorrent::aux::session_impl> ptr;
  session_impl *this_local;
  
  ptr.super___shared_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  ::std::enable_shared_from_this<libtorrent::aux::session_impl>::shared_from_this
            ((enable_shared_from_this<libtorrent::aux::session_impl> *)local_20);
  ctx = this->m_io_context;
  ::std::shared_ptr<libtorrent::aux::session_impl>::shared_ptr
            ((shared_ptr<libtorrent::aux::session_impl> *)local_50,
             (shared_ptr<libtorrent::aux::session_impl> *)local_20);
  make_handler<libtorrent::aux::session_impl::call_abort()::_lambda()_1_,72ul,(libtorrent::aux::HandlerName)4>
            (&local_40,local_50,
             (anon_class_16_1_ba1d6e4e_for_handler *)&this->m_abort_handler_storage,
             (handler_storage<72UL,_(libtorrent::aux::HandlerName)4> *)
             &this->super_error_handler_interface,in_R8);
  boost::asio::
  dispatch<boost::asio::io_context,libtorrent::aux::allocating_handler<libtorrent::aux::session_impl::call_abort()::_lambda()_1_,72ul,(libtorrent::aux::HandlerName)4>>
            (ctx,&local_40,(type *)0x0);
  allocating_handler<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/include/libtorrent/aux_/session_impl.hpp:352:41),_72UL,_(libtorrent::aux::HandlerName)4>
  ::~allocating_handler(&local_40);
  call_abort()::{lambda()#1}::~call_abort((_lambda___1_ *)local_50);
  ::std::shared_ptr<libtorrent::aux::session_impl>::~shared_ptr
            ((shared_ptr<libtorrent::aux::session_impl> *)local_20);
  return;
}

Assistant:

void call_abort()
			{
				auto ptr = shared_from_this();
				dispatch(m_io_context, make_handler([ptr] { ptr->abort(); }
					, m_abort_handler_storage, *this));
			}